

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::UniformCase::renderTest
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,ShaderProgram *program,Random *rnd)

{
  CallLogWrapper *pCVar1;
  pointer *pppTVar2;
  pointer *pppTVar3;
  iterator __position;
  iterator __position_00;
  PixelBufferAccess *pPVar4;
  iterator iVar5;
  RenderContext *context;
  uint x;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar6;
  deUint32 dVar7;
  GLenum GVar8;
  GLuint index;
  RenderTarget *pRVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var10;
  TextureCube *pTVar11;
  Surface *surface;
  uint y;
  pointer pBVar12;
  VarValue *value;
  VarValue *value_00;
  void *__buf;
  int face;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Texture2D *texture;
  Surface renderedImg;
  Vec4 color;
  string local_270;
  string local_250;
  TextureFormat local_230;
  VarValue *local_228;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *local_220;
  int local_214;
  int local_210;
  uint local_20c;
  Surface local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f0;
  vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *local_1e8;
  vector<glu::TextureCube*,std::allocator<glu::TextureCube*>> *local_1e0;
  ShaderProgram *local_1d8;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_1d0;
  TextureCube *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [24];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  local_230 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_1d8 = program;
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar14 = pRVar9->m_width;
  local_214 = 0x20;
  if (iVar14 < 0x20) {
    local_214 = iVar14;
  }
  iVar18 = 0x20;
  if (pRVar9->m_height < 0x20) {
    iVar18 = pRVar9->m_height;
  }
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  local_20c = dVar7 % ((iVar14 - local_214) + 1U);
  iVar14 = pRVar9->m_height;
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  y = dVar7 % ((iVar14 - iVar18) + 1U);
  local_210 = iVar18;
  tcu::Surface::Surface(&local_208,local_214,iVar18);
  pBVar12 = (basicUniforms->
            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_220 = basicUniforms;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3) *
          0x286bca1b) {
    local_1f0 = &this->m_filledTextureUnits;
    pCVar1 = &this->super_CallLogWrapper;
    local_1e0 = (vector<glu::TextureCube*,std::allocator<glu::TextureCube*>> *)&this->m_texturesCube
    ;
    local_1e8 = (vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&this->m_textures2d;
    lVar13 = 0;
    do {
      local_1c0 = lVar13;
      if ((pBVar12[lVar13].type - TYPE_SAMPLER_1D < 0x1e) &&
         (_Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((this->m_filledTextureUnits).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->m_filledTextureUnits).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
                              &pBVar12[lVar13].finalValue.val),
         _Var10._M_current ==
         (this->m_filledTextureUnits).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        local_1b8._0_4_ = local_230.order;
        local_1b8._4_4_ = local_230.type;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,"// Filling texture at unit ",0x1b);
        apiVarValueStr_abi_cxx11_
                  (&local_270,
                   (Functional *)
                   &(local_220->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar13].finalValue,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0," with color ",0xc);
        shaderVarValueStr_abi_cxx11_
                  (&local_250,
                   (Functional *)
                   &(local_220->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar13].finalValue,value_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,local_250._M_dataplus._M_p,local_250._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
        std::ios_base::~ios_base(local_140);
        pBVar12 = (local_220->
                  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_228 = &pBVar12[lVar13].finalValue;
        (this->super_CallLogWrapper).m_enableLog = false;
        local_1b8 = *(undefined1 (*) [8])((long)&pBVar12[lVar13].finalValue.val + 4);
        auStack_1b0._0_8_ = *(undefined8 *)((long)&pBVar12[lVar13].finalValue.val + 0xc);
        if (local_228->type == TYPE_SAMPLER_CUBE) {
          pTVar11 = (TextureCube *)operator_new(0x180);
          glu::TextureCube::TextureCube
                    (pTVar11,((this->super_TestCase).m_context)->m_renderCtx,0x1908,0x1401,0x20);
          __position_00._M_current =
               (this->m_texturesCube).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_270._M_dataplus._M_p = (pointer)pTVar11;
          if (__position_00._M_current ==
              (this->m_texturesCube).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::TextureCube*,std::allocator<glu::TextureCube*>>::
            _M_realloc_insert<glu::TextureCube*const&>
                      (local_1e0,__position_00,(TextureCube **)&local_270);
          }
          else {
            *__position_00._M_current = pTVar11;
            pppTVar3 = &(this->m_texturesCube).
                        super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar3 = *pppTVar3 + 1;
          }
          local_1c8 = &pTVar11->m_refTexture;
          local_1d0 = (pTVar11->m_refTexture).m_access;
          lVar13 = 0;
          do {
            pvVar6 = local_1d0;
            tcu::TextureCube::allocLevel(local_1c8,(CubeFace)lVar13,0);
            pPVar4 = pvVar6[lVar13].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]) {
              iVar14 = 0;
              do {
                if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]) {
                  iVar18 = 0;
                  do {
                    if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                      iVar17 = 0;
                      do {
                        tcu::PixelBufferAccess::setPixel
                                  (pPVar4,(Vec4 *)local_1b8,iVar17,iVar18,iVar14);
                        iVar17 = iVar17 + 1;
                      } while (iVar17 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          glu::CallLogWrapper::glActiveTexture(pCVar1,(local_228->val).intV[0] + 0x84c0);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4dd);
          local_250._M_dataplus._M_p._0_4_ = (local_228->val).intV[0];
          iVar5._M_current =
               (this->m_filledTextureUnits).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_filledTextureUnits).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_1f0,iVar5,(uint *)&local_250);
          }
          else {
            *iVar5._M_current = (local_228->val).intV[0];
            (this->m_filledTextureUnits).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          glu::TextureCube::upload((TextureCube *)local_270._M_dataplus._M_p);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2802,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4e1);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2803,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4e2);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4e3);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4e4);
        }
        else if (local_228->type == TYPE_SAMPLER_2D) {
          pTVar11 = (TextureCube *)operator_new(0x70);
          glu::Texture2D::Texture2D
                    ((Texture2D *)pTVar11,((this->super_TestCase).m_context)->m_renderCtx,0x1908,
                     0x1401,0x20,0x20);
          __position._M_current =
               (this->m_textures2d).
               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_270._M_dataplus._M_p = (pointer)pTVar11;
          if (__position._M_current ==
              (this->m_textures2d).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
            _M_realloc_insert<glu::Texture2D*const&>(local_1e8,__position,(Texture2D **)&local_270);
          }
          else {
            *__position._M_current = (Texture2D *)pTVar11;
            pppTVar2 = &(this->m_textures2d).
                        super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar2 = *pppTVar2 + 1;
          }
          tcu::Texture2D::allocLevel((Texture2D *)&(pTVar11->m_refTexture).m_size,0);
          pPVar4 = *(PixelBufferAccess **)
                    &(((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                        *)((long)(pTVar11->m_refTexture).m_data + 0x18))->
                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                     )._M_impl.super__Vector_impl_data;
          if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]) {
            iVar14 = 0;
            do {
              if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]) {
                iVar18 = 0;
                do {
                  if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                    iVar17 = 0;
                    do {
                      tcu::PixelBufferAccess::setPixel
                                (pPVar4,(Vec4 *)local_1b8,iVar17,iVar18,iVar14);
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]);
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]);
          }
          glu::CallLogWrapper::glActiveTexture(pCVar1,(local_228->val).intV[0] + 0x84c0);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4c7);
          local_250._M_dataplus._M_p._0_4_ = (local_228->val).intV[0];
          iVar5._M_current =
               (this->m_filledTextureUnits).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_filledTextureUnits).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_1f0,iVar5,(uint *)&local_250);
          }
          else {
            *iVar5._M_current = (local_228->val).intV[0];
            (this->m_filledTextureUnits).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          (**(code **)(*(long *)local_270._M_dataplus._M_p + 0x10))();
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4ca);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4cb);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4cc);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x4cd);
        }
        (this->super_CallLogWrapper).m_enableLog = true;
      }
      lVar13 = local_1c0 + 1;
      pBVar12 = (local_220->
                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar13 < (int)((ulong)((long)(local_220->
                                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar12) >> 3) * 0x286bca1b);
  }
  x = local_20c;
  pCVar1 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glViewport(pCVar1,local_20c,y,local_214,local_210);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportW, viewportH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x69f);
  index = glu::CallLogWrapper::glGetAttribLocation
                    (pCVar1,(local_1d8->m_program).m_program,"a_position");
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,index);
  glu::CallLogWrapper::glVertexAttribPointer(pCVar1,index,4,0x1406,'\0',0,renderTest::position);
  glu::CallLogWrapper::glDrawElements(pCVar1,4,6,0x1403,renderTest::indices);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,
                  "glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x6b0);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_270._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_208.m_pixels.m_cap != (void *)0x0) {
    local_208.m_pixels.m_cap = (size_t)local_208.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_270,local_208.m_width,
             local_208.m_height,1,(void *)local_208.m_pixels.m_cap);
  glu::readPixels(context,x,y,(PixelBufferAccess *)local_1b8);
  if (local_208.m_height < 1) {
    iVar14 = 0;
  }
  else {
    iVar18 = 0;
    iVar17 = 0;
    iVar14 = 0;
    do {
      uVar15 = (ulong)(uint)local_208.m_width;
      iVar16 = iVar18;
      if (0 < local_208.m_width) {
        do {
          iVar14 = iVar14 + (uint)(*(int *)((long)local_208.m_pixels.m_ptr + (long)iVar16 * 4) != -1
                                  );
          iVar16 = iVar16 + 1;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      iVar17 = iVar17 + 1;
      iVar18 = iVar18 + local_208.m_width;
    } while (iVar17 != local_208.m_height);
  }
  if (iVar14 < 1) {
    local_1b8._0_4_ = local_230.order;
    local_1b8._4_4_ = local_230.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0,
               "Success: got all-white pixels (all uniforms have correct values)",0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"RenderedImage","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Rendered image","");
    surface = &local_208;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_270,&local_250,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,local_230.order,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])((long)auStack_1b0 + 8)) {
      operator_delete((void *)local_1b8,auStack_1b0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_1b8._0_4_ = local_230.order;
    local_1b8._4_4_ = local_230.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0,"FAILURE: image comparison failed, got ",0x26);
    std::ostream::operator<<((ostringstream *)auStack_1b0,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0," non-white pixels",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
  std::ios_base::~ios_base(local_140);
  tcu::Surface::~Surface(&local_208);
  return iVar14 < 1;
}

Assistant:

bool UniformCase::renderTest (const vector<BasicUniform>& basicUniforms, const ShaderProgram& program, Random& rnd)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	const int					viewportW		= de::min(renderTarget.getWidth(),	MAX_RENDER_WIDTH);
	const int					viewportH		= de::min(renderTarget.getHeight(),	MAX_RENDER_HEIGHT);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);
	tcu::Surface				renderedImg		(viewportW, viewportH);

	// Assert that no two samplers of different types have the same texture unit - this is an error in GL.
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type))
		{
			for (int j = 0; j < i; j++)
			{
				if (glu::isDataTypeSampler(basicUniforms[j].type) && basicUniforms[i].type != basicUniforms[j].type)
					DE_ASSERT(basicUniforms[i].finalValue.val.samplerV.unit != basicUniforms[j].finalValue.val.samplerV.unit);
			}
		}
	}

	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type) && std::find(m_filledTextureUnits.begin(), m_filledTextureUnits.end(), basicUniforms[i].finalValue.val.samplerV.unit) == m_filledTextureUnits.end())
		{
			log << TestLog::Message << "// Filling texture at unit " << apiVarValueStr(basicUniforms[i].finalValue) << " with color " << shaderVarValueStr(basicUniforms[i].finalValue) << TestLog::EndMessage;
			setupTexture(basicUniforms[i].finalValue);
		}
	}

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportW, viewportH));

	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		const int posLoc = glGetAttribLocation(program.getProgram(), "a_position");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);

		GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]));
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	int numFailedPixels = 0;
	for (int y = 0; y < renderedImg.getHeight(); y++)
	{
		for (int x = 0; x < renderedImg.getWidth(); x++)
		{
			if (renderedImg.getPixel(x, y) != tcu::RGBA::white())
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("RenderedImage", "Rendered image", renderedImg);
		log << TestLog::Message << "FAILURE: image comparison failed, got " << numFailedPixels << " non-white pixels" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "Success: got all-white pixels (all uniforms have correct values)" << TestLog::EndMessage;
		return true;
	}
}